

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  short sVar2;
  FT_ListNode pFVar3;
  ulong uVar4;
  FT_Bitmap_Size *pFVar5;
  long lVar6;
  FT_Face_Internal pFVar7;
  FT_Bool external_stream;
  bool bVar8;
  FT_Library pFVar9;
  uint uVar10;
  int iVar11;
  unsigned_long uVar12;
  FT_ListNode pFVar13;
  FT_Stream pFVar14;
  FT_Stream pFVar15;
  FT_Module *ppFVar16;
  FT_Face_conflict face_00;
  FT_Int num_params;
  FT_Parameter *params;
  FT_ListRec *pFVar17;
  FT_Parameter *pFVar18;
  FT_Error FVar19;
  uint uVar20;
  FT_Driver driver;
  FT_Driver pFVar21;
  FT_Memory pFVar22;
  char cVar23;
  long lVar24;
  bool bVar25;
  FT_Stream stream;
  FT_Face face;
  char *file_names [9];
  FT_Error errors [9];
  FT_Open_Args args2;
  FT_Long offsets [9];
  FT_Stream local_1b8;
  FT_Face_conflict *local_1b0;
  FT_Library local_1a8;
  FT_Open_Args *local_1a0;
  FT_Face_conflict local_198;
  FT_Stream local_190;
  FT_Stream local_188;
  undefined8 local_180;
  FT_Memory local_178;
  FT_Stream local_170;
  undefined8 local_168;
  char local_129;
  char local_11e;
  char local_116;
  byte local_115;
  byte local_114;
  byte local_113;
  byte local_112;
  FT_Error local_e8 [12];
  FT_Open_Args local_b8;
  FT_Long local_78 [9];
  
  local_1b8 = (FT_Stream)0x0;
  local_198 = (FT_Face)0x0;
  FVar19 = 6;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    uVar20 = 0;
  }
  else {
    uVar20 = (uint)(args->stream != (FT_Stream)0x0);
  }
  local_1b0 = aface;
  uVar10 = FT_Stream_New(library,args,&local_1b8);
  external_stream = (FT_Bool)uVar20;
  local_1a8 = library;
  local_1a0 = args;
  if (uVar10 == 0) {
    local_178 = library->memory;
    if (((args->flags & 8) == 0) || (driver = (FT_Driver)args->driver, driver == (FT_Driver)0x0)) {
      if ((ulong)library->num_modules == 0) {
        uVar10 = 0xb;
        goto LAB_00133533;
      }
      pFVar15 = (FT_Stream)(library->modules + library->num_modules);
      ppFVar16 = library->modules;
      uVar10 = 0xb;
      local_180 = (FT_Driver)CONCAT44(local_180._4_4_,uVar20);
      pFVar21 = (FT_Driver)0x0;
      local_188 = pFVar15;
      do {
        driver = (FT_Driver)*ppFVar16;
        if ((((driver->root).clazz)->module_flags & 1) != 0) {
          if ((local_1a0->flags & 0x10) == 0) {
            params = (FT_Parameter *)0x0;
            pFVar18 = (FT_Parameter *)0x0;
          }
          else {
            params = (FT_Parameter *)(ulong)(uint)local_1a0->num_params;
            pFVar18 = local_1a0->params;
          }
          uVar10 = open_face(driver,&local_1b8,(FT_Bool)local_180,face_index,(FT_Int)params,pFVar18,
                             &local_198);
          if (uVar10 == 0) {
            cVar23 = '\x03';
          }
          else if (((test_mac_fonts == '\0') ||
                   (iVar11 = strcmp((*ppFVar16)->clazz->module_name,"truetype"), pFVar15 = local_1b8
                   , (char)uVar10 != -0x72)) || (iVar11 != 0)) {
LAB_00133704:
            cVar23 = ((char)uVar10 != '\x02') * '\x02';
          }
          else {
            if (local_1b8->read == (FT_Stream_IoFunc)0x0) {
              uVar10 = 0;
              bVar25 = true;
            }
            else {
              uVar12 = (*local_1b8->read)(local_1b8,0,(uchar *)0x0,0);
              bVar25 = uVar12 == 0;
              uVar10 = 0x55;
              if (bVar25) {
                uVar10 = 0;
              }
            }
            if (bVar25) {
              pFVar15->pos = 0;
            }
            cVar23 = '\x05';
            if (uVar10 == 0) {
              uVar10 = open_face_PS_from_sfnt_stream
                                 (local_1a8,pFVar15,face_index,(FT_Int)local_1b0,params,
                                  (FT_Face_conflict *)pFVar18);
              if (uVar10 != 0) goto LAB_00133704;
              cVar23 = '\x01';
              FVar19 = 0;
              if (pFVar15 != (FT_Stream)0x0) {
                pFVar22 = pFVar15->memory;
                if (pFVar15->close != (FT_Stream_CloseFunc)0x0) {
                  local_190 = pFVar15;
                  (*pFVar15->close)(pFVar15);
                  pFVar15 = local_190;
                }
                if (external_stream == '\0') {
                  (*pFVar22->free)(pFVar22,pFVar15);
                }
              }
            }
          }
          pFVar15 = local_188;
          pFVar21 = driver;
          if (cVar23 != '\0') {
            if (cVar23 != '\x02') {
              if (cVar23 == '\x03') goto LAB_00133b84;
              if (cVar23 != '\x05') {
                return FVar19;
              }
            }
            break;
          }
        }
        driver = pFVar21;
        ppFVar16 = ppFVar16 + 1;
        pFVar21 = driver;
      } while (ppFVar16 < pFVar15);
      goto LAB_00133536;
    }
    uVar20 = 0x20;
    if ((((driver->root).clazz)->module_flags & 1) == 0) {
LAB_00133b53:
      pFVar15 = local_1b8;
      bVar25 = true;
      if (local_1b8 == (FT_Stream)0x0) goto LAB_001339fc;
      pFVar22 = local_1b8->memory;
      if (local_1b8->close != (FT_Stream_CloseFunc)0x0) {
        (*local_1b8->close)(local_1b8);
      }
      if (external_stream != '\0') goto LAB_001339fc;
      goto LAB_001339f2;
    }
    if ((args->flags & 0x10) == 0) {
      num_params = 0;
      pFVar18 = (FT_Parameter *)0x0;
    }
    else {
      num_params = args->num_params;
      pFVar18 = args->params;
    }
    uVar20 = open_face(driver,&local_1b8,external_stream,face_index,num_params,pFVar18,&local_198);
    if (uVar20 != 0) goto LAB_00133b53;
LAB_00133b84:
    pFVar13 = (FT_ListNode)(*local_178->alloc)(local_178,0x18);
    face_00 = local_198;
    uVar20 = (uint)(pFVar13 == (FT_ListNode)0x0) << 6;
    if (pFVar13 == (FT_ListNode)0x0) {
      bVar25 = true;
    }
    else {
      pFVar13->prev = (FT_ListNode)0x0;
      pFVar13->next = (FT_ListNode)0x0;
      pFVar13->data = (void *)0x0;
      pFVar13->data = local_198;
      pFVar21 = local_198->driver;
      pFVar3 = (pFVar21->faces_list).tail;
      pFVar17 = (FT_ListRec *)&pFVar3->next;
      if (pFVar3 == (FT_ListNode)0x0) {
        pFVar17 = &pFVar21->faces_list;
      }
      pFVar13->next = (FT_ListNode)0x0;
      pFVar13->prev = pFVar3;
      pFVar17->head = pFVar13;
      (pFVar21->faces_list).tail = pFVar13;
      if (face_index < 0) {
LAB_00133c39:
        uVar4 = face_00->face_flags;
        if ((uVar4 & 1) != 0) {
          if (face_00->height < 0) {
            face_00->height = -face_00->height;
          }
          if ((uVar4 & 0x20) == 0) {
            face_00->max_advance_height = face_00->height;
          }
        }
        if (((uVar4 & 2) != 0) && (iVar11 = face_00->num_fixed_sizes, 0 < (long)iVar11)) {
          pFVar5 = face_00->available_sizes;
          lVar24 = 0;
          do {
            sVar2 = *(short *)((long)&pFVar5->height + lVar24);
            if (sVar2 < 0) {
              *(short *)((long)&pFVar5->height + lVar24) = -sVar2;
            }
            lVar6 = *(long *)((long)&pFVar5->x_ppem + lVar24);
            if (lVar6 < 0) {
              *(long *)((long)&pFVar5->x_ppem + lVar24) = -lVar6;
            }
            lVar6 = *(long *)((long)&pFVar5->y_ppem + lVar24);
            if (lVar6 < 0) {
              *(long *)((long)&pFVar5->y_ppem + lVar24) = -lVar6;
            }
            if (((*(short *)((long)&pFVar5->height + lVar24) < 0) ||
                (*(long *)((long)&pFVar5->x_ppem + lVar24) < 0)) ||
               (*(long *)((long)&pFVar5->y_ppem + lVar24) < 0)) {
              *(undefined4 *)((long)&pFVar5->height + lVar24) = 0;
              puVar1 = (undefined8 *)((long)&pFVar5->size + lVar24);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)&pFVar5->y_ppem + lVar24) = 0;
            }
            lVar24 = lVar24 + 0x20;
          } while ((long)iVar11 * 0x20 != lVar24);
        }
        pFVar7 = face_00->internal;
        (pFVar7->transform_matrix).xx = 0x10000;
        (pFVar7->transform_matrix).xy = 0;
        (pFVar7->transform_matrix).yx = 0;
        (pFVar7->transform_matrix).yy = 0x10000;
        (pFVar7->transform_delta).x = 0;
        (pFVar7->transform_delta).y = 0;
        pFVar7->refcount = 1;
        pFVar7->no_stem_darkening = -1;
        if (local_1b0 != (FT_Face_conflict *)0x0) {
          *local_1b0 = face_00;
          return uVar20;
        }
        goto LAB_00133a1d;
      }
      bVar25 = false;
      uVar20 = FT_New_GlyphSlot(local_198,(FT_GlyphSlot *)0x0);
      if (uVar20 == 0) {
        uVar20 = FT_New_Size(face_00,(FT_Size *)&local_168);
        if (uVar20 == 0) {
          face_00->size =
               (FT_Size)CONCAT62(local_168._2_6_,CONCAT11(local_168._1_1_,(FT_Byte)local_168));
          goto LAB_00133c39;
        }
        bVar25 = false;
      }
    }
  }
  else {
    local_178 = (FT_Memory)0x0;
LAB_00133533:
    driver = (FT_Driver)0x0;
LAB_00133536:
    pFVar15 = local_1b8;
    if ((((char)uVar10 == '\x02') || ((uVar10 & 0xff) == 0x55)) ||
       (uVar20 = uVar10, (uVar10 & 0xff) == 0x51)) {
      if (test_mac_fonts != '\0') {
        if (local_1b8 == (FT_Stream)0x0) {
          uVar10 = 0x55;
        }
        else {
          if (local_1b8->read == (FT_Stream_IoFunc)0x0) {
            uVar10 = 0;
            bVar25 = true;
          }
          else {
            uVar12 = (*local_1b8->read)(local_1b8,0,(uchar *)0x0,0);
            bVar25 = uVar12 == 0;
            uVar10 = 0x55;
            if (bVar25) {
              uVar10 = 0;
            }
          }
          if (bVar25) {
            pFVar15->pos = 0;
          }
          if (uVar10 == 0) {
            uVar10 = FT_Stream_Read(pFVar15,(FT_Byte *)&local_168,0x80);
            if ((((uVar10 == 0) && (uVar10 = 2, (FT_Byte)local_168 == '\0')) &&
                (((local_11e == '\0' &&
                  ((local_116 == '\0' && (0xde < (byte)(local_168._1_1_ - 0x22))))) &&
                 (local_129 == '\0')))) &&
               (-1 < (char)local_115 &&
                *(FT_Byte *)((long)&local_168 + (ulong)local_168._1_1_ + 2) == '\0')) {
              uVar10 = IsMacResource(local_1a8,pFVar15,
                                     ((ulong)((uint)local_113 << 8 |
                                             (uint)local_114 << 0x10 | (uint)local_115 << 0x18) +
                                      (ulong)local_112 + 0x7f & 0xffffffffffffff80) + 0x80,
                                     face_index,local_1b0);
            }
          }
        }
        pFVar9 = local_1a8;
        if ((char)uVar10 == '\x02') {
          uVar10 = IsMacResource(local_1a8,pFVar15,0,face_index,local_1b0);
        }
        if ((((char)uVar10 == 'U') || ((uVar10 & 0xff) == 2)) && ((local_1a0->flags & 4) != 0)) {
          pFVar22 = pFVar9->memory;
          local_170 = (FT_Stream)0x0;
          local_188 = pFVar15;
          local_180 = driver;
          FT_Raccess_Guess(pFVar9,pFVar15,local_1a0->pathname,(char **)&local_168,local_78,local_e8)
          ;
          iVar11 = 2;
          lVar24 = 0;
          bVar25 = false;
          do {
            pFVar9 = local_1a8;
            uVar20 = (&ft_raccess_guess_table[0].type)[lVar24] + ~FT_RFork_Rule_darwin_ufs_export;
            bVar8 = bVar25;
            if (((1 < uVar20) || (!bVar25)) && (*(int *)((long)local_e8 + lVar24) == 0)) {
              local_b8.flags = 4;
              local_b8.pathname = *(FT_String **)((long)&local_168 + lVar24 * 2);
              if (local_b8.pathname == (FT_String *)0x0) {
                local_b8.pathname = local_1a0->pathname;
              }
              iVar11 = FT_Stream_New(local_1a8,&local_b8,&local_170);
              pFVar15 = local_170;
              if ((char)iVar11 == 'Q') {
                bVar8 = true;
              }
              if (1 < uVar20) {
                bVar8 = bVar25;
              }
              if (iVar11 == 0) {
                iVar11 = IsMacResource(pFVar9,local_170,*(FT_Long *)((long)local_78 + lVar24 * 2),
                                       face_index,local_1b0);
                if (pFVar15 != (FT_Stream)0x0) {
                  pFVar14 = (FT_Stream)pFVar15->memory;
                  if (pFVar15->close != (FT_Stream_CloseFunc)0x0) {
                    local_190 = (FT_Stream)pFVar15->memory;
                    (*pFVar15->close)(pFVar15);
                    pFVar14 = local_190;
                  }
                  (*(code *)pFVar14->pos)(pFVar14,pFVar15);
                }
                if (iVar11 == 0) {
                  iVar11 = 0;
                  break;
                }
                bVar8 = bVar25;
                if (uVar20 < 2) {
                  bVar8 = true;
                }
              }
            }
            bVar25 = bVar8;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 0x24);
          driver = local_180;
          pFVar15 = local_188;
          lVar24 = 0;
          do {
            if ((void *)(&local_168)[lVar24] != (void *)0x0) {
              (*pFVar22->free)(pFVar22,(void *)(&local_168)[lVar24]);
              (&local_168)[lVar24] = 0;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != 9);
          uVar10 = (uint)(iVar11 != 0) * 2;
        }
        if (uVar10 == 0) {
          if (pFVar15 == (FT_Stream)0x0) {
            return 0;
          }
          pFVar22 = pFVar15->memory;
          if (pFVar15->close != (FT_Stream_CloseFunc)0x0) {
            (*pFVar15->close)(pFVar15);
          }
          if (external_stream != '\0') {
            return 0;
          }
          (*pFVar22->free)(pFVar22,pFVar15);
          return 0;
        }
      }
      uVar20 = 2;
      if ((char)uVar10 != '\x02') {
        uVar20 = uVar10;
      }
    }
    pFVar15 = local_1b8;
    bVar25 = true;
    if (local_1b8 != (FT_Stream)0x0) {
      pFVar22 = local_1b8->memory;
      if (local_1b8->close != (FT_Stream_CloseFunc)0x0) {
        (*local_1b8->close)(local_1b8);
      }
      if (external_stream == '\0') {
LAB_001339f2:
        bVar25 = true;
        (*pFVar22->free)(pFVar22,pFVar15);
      }
    }
  }
LAB_001339fc:
  face_00 = local_198;
  if (bVar25) {
    if (local_198 == (FT_Face)0x0) {
      return uVar20;
    }
    destroy_face(local_178,local_198,driver);
    return uVar20;
  }
LAB_00133a1d:
  FT_Done_Face(face_00);
  return uVar20;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }